

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::DataPageHeader::DataPageHeader(DataPageHeader *this,DataPageHeader *other62)

{
  type tVar1;
  type tVar2;
  type tVar3;
  
  *(undefined ***)this = &PTR__DataPageHeader_004a6be8;
  *(undefined ***)&this->statistics = &PTR__Statistics_004a6360;
  (this->statistics).max._M_dataplus._M_p = (pointer)&(this->statistics).max.field_2;
  (this->statistics).max._M_string_length = 0;
  (this->statistics).max.field_2._M_local_buf[0] = '\0';
  (this->statistics).min._M_dataplus._M_p = (pointer)&(this->statistics).min.field_2;
  (this->statistics).min._M_string_length = 0;
  (this->statistics).min.field_2._M_local_buf[0] = '\0';
  (this->statistics).null_count = 0;
  (this->statistics).distinct_count = 0;
  (this->statistics).max_value._M_dataplus._M_p = (pointer)&(this->statistics).max_value.field_2;
  (this->statistics).max_value._M_string_length = 0;
  (this->statistics).max_value.field_2._M_local_buf[0] = '\0';
  (this->statistics).min_value._M_dataplus._M_p = (pointer)&(this->statistics).min_value.field_2;
  (this->statistics).min_value._M_string_length = 0;
  (this->statistics).min_value.field_2._M_local_buf[0] = '\0';
  (this->statistics).is_max_value_exact = false;
  (this->statistics).is_min_value_exact = false;
  (this->statistics).__isset = (_Statistics__isset)0x0;
  this->__isset = (_DataPageHeader__isset)((byte)this->__isset & 0xfe);
  tVar1 = other62->encoding;
  tVar2 = other62->definition_level_encoding;
  tVar3 = other62->repetition_level_encoding;
  this->num_values = other62->num_values;
  this->encoding = tVar1;
  this->definition_level_encoding = tVar2;
  this->repetition_level_encoding = tVar3;
  Statistics::operator=(&this->statistics,&other62->statistics);
  this->__isset = other62->__isset;
  return;
}

Assistant:

DataPageHeader::DataPageHeader(const DataPageHeader& other62) {
  num_values = other62.num_values;
  encoding = other62.encoding;
  definition_level_encoding = other62.definition_level_encoding;
  repetition_level_encoding = other62.repetition_level_encoding;
  statistics = other62.statistics;
  __isset = other62.__isset;
}